

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall State::State(State *this,int w,int h)

{
  int *__last;
  undefined1 auVar1 [16];
  int *__first;
  ulong uVar2;
  State local_70;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  result_type local_30;
  long seed;
  int *piStack_20;
  int i;
  int *numbers;
  int h_local;
  int w_local;
  State *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(w * h);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  numbers._0_4_ = h;
  numbers._4_4_ = w;
  _h_local = this;
  piStack_20 = (int *)operator_new__(uVar2);
  for (seed._4_4_ = 0; seed._4_4_ < numbers._4_4_ * (int)numbers; seed._4_4_ = seed._4_4_ + 1) {
    piStack_20[seed._4_4_] = seed._4_4_;
  }
  local_40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_38.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_40);
  local_30 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_38);
  __first = piStack_20;
  __last = piStack_20 + numbers._4_4_ * (int)numbers;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_48,local_30);
  std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__last,&local_48);
  State(&local_70,numbers._4_4_,(int)numbers,piStack_20);
  operator=(this,&local_70);
  ~State(&local_70);
  if (piStack_20 != (int *)0x0) {
    operator_delete__(piStack_20);
  }
  return;
}

Assistant:

State::State(int w, int h) {
    auto numbers = new int[w * h];
    for (int i = 0; i < w * h; i++) {
        numbers[i] = i;
    }

    long seed = std::chrono::high_resolution_clock::now().time_since_epoch().count();
    std::shuffle(&numbers[0], &numbers[w * h], std::default_random_engine(seed));

    *this = State(w, h, numbers);
    delete[] numbers;
}